

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

void __thiscall
boost::runtime::
parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)2,_false>
::produce_argument(parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)2,_false>
                   *this,cstring *token,bool param_3,arguments_store *store)

{
  std_string *s;
  byte in_DL;
  basic_cstring<const_char> *in_RSI;
  long in_RDI;
  arguments_store *in_stack_000000a8;
  cstring *in_stack_000000b0;
  cstring *in_stack_000000b8;
  argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
  *in_stack_000000c0;
  basic_cstring<const_char> *in_stack_ffffffffffffffc0;
  basic_cstring<const_char> local_30;
  byte local_11;
  
  local_11 = in_DL & 1;
  s = (std_string *)(in_RDI + 0xe8);
  unit_test::basic_cstring<const_char>::basic_cstring(&local_30,in_RSI);
  unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffffc0,s);
  argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
  ::produce_argument(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  return;
}

Assistant:

virtual void    produce_argument( cstring token, bool , arguments_store& store ) const
    {
        m_arg_factory.produce_argument( token, this->p_name, store );
    }